

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcombobox.cpp
# Opt level: O1

void __thiscall QComboBox::~QComboBox(QComboBox *this)

{
  long lVar1;
  int *piVar2;
  int in_ESI;
  long *plVar3;
  long lVar4;
  
  *(undefined ***)&this->super_QWidget = &PTR_metaObject_007fdd90;
  *(undefined ***)&(this->super_QWidget).super_QPaintDevice = &PTR__QComboBox_007fdf60;
  lVar1 = *(long *)&(this->super_QWidget).field_0x8;
  lVar4 = 0;
  do {
    QObject::disconnect((Connection *)(lVar1 + 600 + lVar4));
    lVar4 = lVar4 + 8;
  } while (lVar4 != 0x40);
  if (((*(long *)(lVar1 + 0x2a8) != 0) && (*(int *)(*(long *)(lVar1 + 0x2a8) + 4) != 0)) &&
     (*(long *)(lVar1 + 0x2b0) != 0)) {
    QWidget::close(*(QWidget **)(lVar1 + 0x2b0),in_ESI);
    if ((*(long *)(lVar1 + 0x2a8) == 0) || (*(int *)(*(long *)(lVar1 + 0x2a8) + 4) == 0)) {
      plVar3 = (long *)0x0;
    }
    else {
      plVar3 = *(long **)(lVar1 + 0x2b0);
    }
    if (plVar3 != (long *)0x0) {
      (**(code **)(*plVar3 + 0x20))();
    }
    piVar2 = *(int **)(lVar1 + 0x2a8);
    *(undefined8 *)(lVar1 + 0x2a8) = 0;
    *(undefined8 *)(lVar1 + 0x2b0) = 0;
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (*piVar2 == 0) {
        operator_delete(piVar2);
      }
    }
  }
  QWidget::~QWidget(&this->super_QWidget);
  return;
}

Assistant:

QComboBox::~QComboBox()
{
    // ### check delegateparent and delete delegate if us?
    Q_D(QComboBox);

    QT_TRY {
        d->disconnectModel();
    }